

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

string * cmsys::SystemTools::MakeCidentifier(string *__return_storage_ptr__,string *s)

{
  long lVar1;
  string permited_chars;
  allocator local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  lVar1 = std::__cxx11::string::find_first_of((char *)__return_storage_ptr__,0x555159);
  if (lVar1 == 0) {
    std::operator+(&local_30,"_",__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  std::__cxx11::string::string
            ((string *)&local_30,"_abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789",
             &local_31);
  while( true ) {
    lVar1 = std::__cxx11::string::find_first_not_of
                      ((string *)__return_storage_ptr__,(ulong)&local_30);
    if (lVar1 == -1) break;
    (__return_storage_ptr__->_M_dataplus)._M_p[lVar1] = '_';
  }
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

kwsys_stl::string SystemTools::MakeCidentifier(const kwsys_stl::string& s)
{
  kwsys_stl::string str(s);
  if (str.find_first_of("0123456789") == 0)
    {
    str = "_" + str;
    }

  kwsys_stl::string permited_chars("_"
                             "abcdefghijklmnopqrstuvwxyz"
                             "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                             "0123456789");
  kwsys_stl::string::size_type pos = 0;
  while ((pos = str.find_first_not_of(permited_chars, pos)) != kwsys_stl::string::npos)
    {
    str[pos] = '_';
    }
  return str;
}